

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::process_comments(CTcTokenizer *this,size_t start_ofs)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  tok_embed_level *ptVar3;
  char *pcVar4;
  bool bVar6;
  bool bVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t wVar10;
  uint uVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  byte *p;
  byte *p_00;
  ulong uVar16;
  utf8_ptr local_48;
  tok_embed_ctx *local_40;
  tok_embed_level *local_38;
  
  p = (byte *)((this->linebuf_).buf_ + start_ofs);
  local_48.p_ = (char *)p;
  wVar8 = utf8_ptr::s_getch((char *)p);
  if (wVar8 == L'\0') {
    bVar7 = true;
  }
  else {
    local_38 = (this->comment_in_embedding_).stk;
    local_40 = &this->comment_in_embedding_;
    bVar7 = false;
    p_00 = p;
    do {
      wVar8 = utf8_ptr::s_getch((char *)p);
      if ((this->str_->field_0x28 & 2) == 0) {
        if (this->in_quote_ == L'\0') {
          bVar6 = true;
          if (((wVar8 != L'\\') && (bVar6 = false, (uint)wVar8 < 0x80)) &&
             (iVar9 = isspace(wVar8), bVar6 = bVar7, iVar9 == 0)) {
            bVar6 = false;
          }
          bVar7 = bVar6;
          if ((wVar8 == L'\"') || (wVar8 == L'\'')) {
            this->in_quote_ = wVar8;
            iVar9 = count_quotes(&local_48,wVar8);
            this->in_triple_ = (uint)(2 < iVar9);
            if (2 < iVar9) {
              lVar14 = -2;
              do {
                p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0);
              local_48.p_ = (char *)p;
              sVar12 = utf8_ptr::s_putch((char *)p_00,wVar8);
              sVar13 = utf8_ptr::s_putch((char *)(p_00 + sVar12),wVar8);
              p_00 = p_00 + sVar12 + sVar13;
            }
          }
          else if (wVar8 == L'/') {
            wVar10 = utf8_ptr::s_getch_at((char *)p,1);
            if (wVar10 == L'/') {
              *p_00 = 0;
              p_00 = p_00 + 1;
              bVar6 = true;
              goto LAB_00256b96;
            }
            wVar8 = L'/';
            if (wVar10 == L'*') {
              puVar1 = &this->str_->field_0x28;
              *puVar1 = *puVar1 | 2;
              goto LAB_00256b75;
            }
          }
          else if (wVar8 < L'\t') {
LAB_00256b75:
            wVar8 = L' ';
          }
          else {
            iVar9 = (this->comment_in_embedding_).level;
            if ((wVar8 & 0x7ffffffeU) == 0x28 && iVar9 != 0) {
              ptVar3 = (this->comment_in_embedding_).s;
              ptVar3->parens = ptVar3->parens + (uint)(wVar8 == L'(') * 2 + -1;
              if (ptVar3->parens < 0) {
                ((this->comment_in_embedding_).s)->parens = 0;
              }
            }
            else if (((iVar9 != 0) && (wVar8 == L'>')) &&
                    (((this->comment_in_embedding_).s)->parens == 0)) {
              wVar10 = utf8_ptr::s_getch_at((char *)p,1);
              wVar8 = L'>';
              if (wVar10 == L'>') {
                iVar9 = (this->comment_in_embedding_).level;
                if (iVar9 == 0) {
                  this->in_quote_ = L'\0';
                  iVar15 = 0;
                }
                else {
                  ptVar3 = (this->comment_in_embedding_).s;
                  this->in_quote_ = ptVar3->qu;
                  iVar15 = ptVar3->triple;
                }
                this->in_triple_ = iVar15;
                if (0 < iVar9) {
                  (this->comment_in_embedding_).level = iVar9 + -1;
                }
                iVar9 = (this->comment_in_embedding_).level;
                if ((long)iVar9 == 0) {
                  (this->comment_in_embedding_).s = (tok_embed_level *)0x0;
                }
                else if (iVar9 < 10) {
                  (this->comment_in_embedding_).s = local_40->stk + (long)iVar9 + -1;
                }
                uVar11 = ((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3;
                *p_00 = 0x3e;
                goto LAB_00256b6b;
              }
            }
          }
        }
        else if (wVar8 == L'\\') {
          local_48.p_ = (char *)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1);
          *p_00 = 0x5c;
          p_00 = p_00 + 1;
          wVar8 = utf8_ptr::s_getch(local_48.p_);
          if (((this->in_triple_ != 0) && (wVar8 == this->in_quote_)) &&
             (iVar9 = count_quotes(&local_48,wVar8), 1 < iVar9)) {
            iVar9 = iVar9 + 1;
            do {
              sVar12 = utf8_ptr::s_putch((char *)p_00,wVar8);
              p_00 = p_00 + sVar12;
              local_48.p_ = local_48.p_ +
                            (ulong)((((byte)*local_48.p_ >> 5 & 1) != 0) + 1 &
                                   (uint)((byte)*local_48.p_ >> 7) * 3) + 1;
              iVar9 = iVar9 + -1;
            } while (2 < iVar9);
          }
        }
        else if (wVar8 == this->in_quote_) {
          if (this->in_triple_ == 0) {
            this->in_quote_ = L'\0';
          }
          else {
            iVar9 = count_quotes(&local_48,wVar8);
            if (2 < iVar9) {
              iVar9 = iVar9 + -1;
              do {
                sVar12 = utf8_ptr::s_putch((char *)p_00,wVar8);
                p_00 = p_00 + sVar12;
                local_48.p_ = local_48.p_ +
                              (ulong)((((byte)*local_48.p_ >> 5 & 1) != 0) + 1 &
                                     (uint)((byte)*local_48.p_ >> 7) * 3) + 1;
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
              this->in_quote_ = L'\0';
            }
          }
        }
        else if (wVar8 == L'<') {
          wVar10 = utf8_ptr::s_getch_at((char *)p,1);
          wVar8 = L'<';
          if (wVar10 == L'<') {
            uVar11 = ((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3;
            lVar14 = (long)(this->comment_in_embedding_).level;
            if (lVar14 < 10) {
              (this->comment_in_embedding_).s = local_38 + lVar14;
              local_38[lVar14].parens = 0;
              uVar2 = this->in_quote_;
              uVar5 = this->in_triple_;
              local_38[lVar14].endtok = (uint)(uVar2 == 0x22) * 4 + TOKT_SSTR_END;
              local_38[lVar14].qu = uVar2;
              local_38[lVar14].triple = uVar5;
            }
            (this->comment_in_embedding_).level = (this->comment_in_embedding_).level + 1;
            this->in_quote_ = L'\0';
            *p_00 = 0x3c;
LAB_00256b6b:
            local_48.p_ = (char *)(p + (ulong)uVar11 + 1);
            p_00 = p_00 + 1;
          }
        }
        sVar12 = utf8_ptr::s_putch((char *)p_00,wVar8);
        p_00 = p_00 + sVar12;
        bVar6 = false;
      }
      else {
        bVar6 = false;
        if (wVar8 == L'/') {
          wVar8 = utf8_ptr::s_getch_at((char *)p,1);
          if ((wVar8 == L'*') && ((G_prs->field_0xec & 4) == 0)) {
            log_warning(0x274d);
          }
        }
        else if ((wVar8 == L'*') && (wVar8 = utf8_ptr::s_getch_at((char *)p,1), wVar8 == L'/')) {
          local_48.p_ = (char *)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1);
          puVar1 = &this->str_->field_0x28;
          *puVar1 = *puVar1 & 0xfd;
        }
      }
LAB_00256b96:
      if (bVar6) {
        return;
      }
      p = (byte *)(local_48.p_ +
                  (ulong)((((byte)*local_48.p_ >> 5 & 1) != 0) + 1 &
                         (uint)((byte)*local_48.p_ >> 7) * 3) + 1);
      local_48.p_ = (char *)p;
      wVar8 = utf8_ptr::s_getch((char *)p);
    } while (wVar8 != L'\0');
    bVar7 = !bVar7;
    p = p_00;
  }
  pcVar4 = (this->linebuf_).buf_;
  uVar16 = (long)p - (long)pcVar4;
  (this->linebuf_).buf_len_ = uVar16;
  if (uVar16 < (this->linebuf_).buf_size_) {
    pcVar4[uVar16] = '\0';
  }
  if (bVar7) {
    return;
  }
  log_warning(0x274b);
  return;
}

Assistant:

void CTcTokenizer::process_comments(size_t start_ofs)
{
    utf8_ptr src;
    utf8_ptr dst;
    
    /* we haven't found a backslash followed by trailing space yet */
    int trailing_sp_after_bs = FALSE;

    /* 
     *   Scan the line.  When inside a comment, replace each character of
     *   the comment with a space.  When outside comments, simply copy
     *   characters intact.
     *   
     *   Note that we need a separate src and dst pointer, because the
     *   character length of the original and replaced characters may
     *   change.  Fortunately, the length will never do anything but
     *   shrink or stay the same, since the only change we make is to
     *   insert spaces, which are always one byte apiece in UTF-8; we can
     *   therefore update the buffer in place.  
     */
    for (src.set(linebuf_.get_buf() + start_ofs),
         dst.set(linebuf_.get_buf() + start_ofs) ;
         src.getch() != '\0' ; src.inc())
    {
        /* get the current character */
        wchar_t cur = src.getch();

        /* check to see if we're in a comment */
        if (str_->is_in_comment())
        {
            /* 
             *   check to see if the comment is ending, or if we have an
             *   apparent nested comment (which isn't allowed)
             */
            if (cur == '*' && src.getch_at(1) == '/')
            {
                /* 
                 *   skip an extra character of the source - we'll skip
                 *   one in the main loop, so we only need to skip one
                 *   more now 
                 */
                src.inc();
                
                /* we're no longer in a comment */
                str_->set_in_comment(FALSE);
            }
            else if (cur == '/' && src.getch_at(1) == '*')
            {
                /* looks like a nested comment - warn about it */
                if (!G_prs->get_syntax_only())
                    log_warning(TCERR_NESTED_COMMENT);
            }

            /* continue without copying anything from inside the comment */
            continue;
        }
        else if (in_quote_ != '\0')
        {
            /* see what we have */
            if (cur == '\\')
            {
                /* 
                 *   It's a backslash sequence -- copy the backslash to
                 *   the output, and skip it.  Note that we don't have to
                 *   worry about the line ending with a backslash, since
                 *   the line reader will already have considered that to
                 *   be a line splice.  
                 */
                src.inc();
                dst.setch(cur);

                /* get the next character, so we copy it directly */
                cur = src.getch();

                /* 
                 *   if we're in a triple-quoted string, and this is an
                 *   escaped quote, the backslash escapes a whole run of
                 *   consecutive quotes that follow 
                 */
                if (in_triple_ && cur == in_quote_)
                {
                    /* copy and skip any run of quotes, minus the last one */
                    for (int qcnt = count_quotes(&src, cur) ; qcnt > 1 ;
                         dst.setch(cur), src.inc(), --qcnt) ;
                }
            }
            else if (cur == in_quote_)
            {
                /* This is the close quote.  Check for triple quotes. */
                if (in_triple_)
                {
                    /* triple-quoted - we need three quotes in a row */
                    int qcnt = count_quotes(&src, cur);
                    if (qcnt >= 3)
                    {
                        /* copy and skip all but the last in the run */
                        for (int i = 1 ; i < qcnt ; ++i, src.inc())
                            dst.setch(cur);

                        /* close the string */
                        in_quote_ = '\0';
                    }
                }
                else
                {
                    /* regular string, so it ends at the matching quote */
                    in_quote_ = '\0';
                }
            }
            else if (cur == '<' && src.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starting point - skip the
                 *   first of the '<' characters (the enclosing loop will
                 *   skip the second one)
                 */
                src.inc();

                /* we're in an embedding now */
                comment_in_embedding_.start_expr(in_quote_, in_triple_, FALSE);

                /* the string is done for now */
                in_quote_ = '\0';

                /* copy the extra '<' to the output */
                dst.setch('<');
            }
        }
        else
        {
            /*
             *   Monitor the stream for a backslash followed by trailing
             *   spaces.  If this is a backslash, note that we might have a
             *   backslash with trailing spaces; if it's a space, we might
             *   still have this, so leave the flag alone; if it's anything
             *   else, clear the flag, since we've found something other
             *   than backslashes and spaces.  
             */
            if (cur == '\\')
                trailing_sp_after_bs = TRUE;
            else if (!is_space(cur))
                trailing_sp_after_bs = FALSE;
            
            /* check to see if we're starting a comment */
            if (cur == '/')
            {
                switch(src.getch_at(1))
                {
                case '*':
                    /* note that we're starting a comment */
                    str_->set_in_comment(TRUE);

                    /* 
                     *   replace the starting slash with a space - this
                     *   will effectively replace the entire comment with
                     *   a single space, since we won't copy anything else
                     *   from inside the comment 
                     */
                    cur = ' ';
                    break;

                case '/':
                    /* 
                     *   comment to end of line - we can terminate the
                     *   line at the opening slash and return immediately,
                     *   because the entire rest of the line is to be
                     *   ignored 
                     */
                    dst.setch('\0');
                    return;

                default:
                    /* not a comment - copy it as-is */
                    break;
                }
            }
            else if (cur == '"' || cur == '\'')
            {
                /* it's the start of a new string */
                in_quote_ = cur;

                /* check for triple quotes */
                in_triple_ = (count_quotes(&src, cur) >= 3);

                /* if in triple quotes, copy and skip the extra two qutoes */
                if (in_triple_)
                {
                    src.inc_by(2);
                    dst.setch(cur);
                    dst.setch(cur);
                }
            }
            else if (cur < 0x09)
            {
                /* 
                 *   it's a special flag character - we need to guarantee
                 *   that this character never occurs in input (it
                 *   shouldn't anyway, since it's a control character), so
                 *   translate it to a space 
                 */
                cur = ' ';
            }
            else if (comment_in_embedding_.in_expr()
                     && (cur == '(' || cur == ')'))
            {
                /* adjust the paren level in an embedded expression */
                comment_in_embedding_.parens(cur == '(' ? 1 : -1);
            }
            else if (comment_in_embedding_.in_expr()
                     && comment_in_embedding_.parens() == 0
                     && cur == '>' && src.getch_at(1) == '>')
            {
                /* it's the end of an embedded expression */
                in_quote_ = comment_in_embedding_.qu();
                in_triple_ = comment_in_embedding_.triple();
                comment_in_embedding_.end_expr();

                /* skip the extra '>' and copy it to the output */
                src.inc();
                dst.setch('>');
            }
        }

        /* set the current character in the output */
        dst.setch(cur);
    }

    /* set the updated line buffer length */
    linebuf_.set_text_len(dst.getptr() - linebuf_.get_buf());

    /* 
     *   if we found a backslash with nothing following but whitespace, flag
     *   a warning, since they might have meant the backslash as a line
     *   continuation signal, but we're not interpreting it that way because
     *   of the trailing whitespace 
     */
    if (trailing_sp_after_bs)
        log_warning(TCERR_TRAILING_SP_AFTER_BS);
}